

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QOpenGLVertexArrayObjectHelper *
QOpenGLVertexArrayObjectHelper::vertexArrayObjectHelperForContext(QOpenGLContext *context)

{
  long lVar1;
  QOpenGLVertexArrayObjectHelper *this;
  
  lVar1 = *(long *)(context + 8);
  if (*(long *)(lVar1 + 0xe8) == 0) {
    this = (QOpenGLVertexArrayObjectHelper *)operator_new(0x20);
    this->GenVertexArrays = (qt_GenVertexArrays_t)0x0;
    this->DeleteVertexArrays = (qt_DeleteVertexArrays_t)0x0;
    this->BindVertexArray = (qt_BindVertexArray_t)0x0;
    this->IsVertexArray = (qt_IsVertexArray_t)0x0;
    initializeFromContext(this,context);
    *(QOpenGLVertexArrayObjectHelper **)(lVar1 + 0xe8) = this;
    *(code **)(lVar1 + 0xf0) = vertexArrayObjectHelperDestroyCallback;
  }
  return *(QOpenGLVertexArrayObjectHelper **)(lVar1 + 0xe8);
}

Assistant:

T *get() const noexcept
    {
        return d;
    }